

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this)

{
  CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *alloc;
  char cVar1;
  slot_type *psVar2;
  size_t hash;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  FindInfo FVar7;
  HashElement HStack_60;
  slot_type sStack_58;
  
  uVar6 = this->capacity_;
  if (uVar6 == 0) {
    resize(this,1);
    return;
  }
  if (uVar6 - (uVar6 >> 3) >> 1 < this->size_) {
    resize(this,uVar6 * 2 + 1);
    return;
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,this->capacity_);
  alloc = &this->settings_;
  for (uVar6 = 0; uVar6 != this->capacity_; uVar6 = uVar6 + 1) {
    if (this->ctrl_[uVar6] == -2) {
      HStack_60.h = &(this->settings_).
                     super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                     .
                     super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_1UL,_false>
                     .value;
      hash = DecomposePair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>::HashElement,std::pair<std::__cxx11::string_const,int>&>
                       (&HStack_60,&this->slots_[uVar6].value);
      FVar7 = find_first_non_full(this,hash);
      sVar3 = FVar7.offset;
      uVar4 = hash >> 7 & this->capacity_;
      if (((uVar6 - uVar4 ^ sVar3 - uVar4) & this->capacity_) < 0x10) {
        bVar5 = (byte)hash & 0x7f;
        this->ctrl_[uVar6] = bVar5;
        this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar6 - 0x10 & this->capacity_)] =
             bVar5;
      }
      else {
        bVar5 = (byte)hash & 0x7f;
        cVar1 = this->ctrl_[sVar3];
        this->ctrl_[sVar3] = bVar5;
        this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (sVar3 - 0x10 & this->capacity_)] =
             bVar5;
        psVar2 = this->slots_;
        if (cVar1 == -0x80) {
          map_slot_policy<std::__cxx11::string,int>::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)alloc,psVar2 + sVar3,psVar2 + uVar6);
          this->ctrl_[uVar6] = -0x80;
          this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (uVar6 - 0x10 & this->capacity_)] =
               -0x80;
        }
        else {
          map_slot_policy<std::__cxx11::string,int>::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)alloc,&sStack_58,psVar2 + uVar6);
          map_slot_policy<std::__cxx11::string,int>::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)alloc,this->slots_ + uVar6,this->slots_ + sVar3);
          map_slot_policy<std::__cxx11::string,int>::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)alloc,this->slots_ + sVar3,&sStack_58);
          uVar6 = uVar6 - 1;
        }
      }
    }
  }
  (this->settings_).
  super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_0UL,_false>
  .value = uVar6 - ((uVar6 >> 3) + this->size_);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }